

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.h
# Opt level: O3

void __thiscall serial::SerialException::SerialException(SerialException *this,char *description)

{
  size_t sVar1;
  stringstream ss;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  stringstream local_1b0 [16];
  long local_1a0 [14];
  ios_base local_130 [264];
  
  *(undefined ***)this = &PTR__SerialException_0011d908;
  (this->e_what_)._M_dataplus._M_p = (pointer)&(this->e_what_).field_2;
  (this->e_what_)._M_string_length = 0;
  (this->e_what_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"SerialException ",0x10);
  if (description == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  }
  else {
    sVar1 = strlen(description);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,description,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," failed.",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->e_what_,(string *)local_1d0);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0]);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

SerialException (const char *description) {
      std::stringstream ss;
      ss << "SerialException " << description << " failed.";
      e_what_ = ss.str();
  }